

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InstrumentPass::Gen32BitCvtCode
          (InstrumentPass *this,uint32_t val_id,InstructionBuilder *builder)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  TypeManager *this_00;
  DefUseManager *this_01;
  Instruction *pIVar4;
  Type *pTVar5;
  undefined4 extraout_var;
  Integer val_32b_ty;
  Type local_58;
  byte local_30;
  
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  this_01 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar4 = analysis::DefUseManager::GetDef(this_01,val_id);
  uVar2 = Instruction::type_id(pIVar4);
  pTVar5 = analysis::TypeManager::GetType(this_00,uVar2);
  iVar3 = (*pTVar5->_vptr_Type[9])(pTVar5);
  if (*(int *)(CONCAT44(extraout_var,iVar3) + 0x24) != 0x20) {
    bVar1 = *(byte *)(CONCAT44(extraout_var,iVar3) + 0x28);
    local_58.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.kind_ = kInteger;
    local_58._36_4_ = 0x20;
    local_58._vptr_Type = (_func_int **)&PTR__Type_003b18d0;
    local_30 = bVar1;
    pTVar5 = analysis::TypeManager::GetRegisteredType(this_00,&local_58);
    uVar2 = analysis::TypeManager::GetId(this_00,pTVar5);
    pIVar4 = InstructionBuilder::AddUnaryOp(builder,uVar2,bVar1 + OpUConvert,val_id);
    val_id = Instruction::result_id(pIVar4);
    analysis::Type::~Type(&local_58);
  }
  return val_id;
}

Assistant:

uint32_t InstrumentPass::Gen32BitCvtCode(uint32_t val_id,
                                         InstructionBuilder* builder) {
  // Convert integer value to 32-bit if necessary
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t val_ty_id = get_def_use_mgr()->GetDef(val_id)->type_id();
  analysis::Integer* val_ty = type_mgr->GetType(val_ty_id)->AsInteger();
  if (val_ty->width() == 32) return val_id;
  bool is_signed = val_ty->IsSigned();
  analysis::Integer val_32b_ty(32, is_signed);
  analysis::Type* val_32b_reg_ty = type_mgr->GetRegisteredType(&val_32b_ty);
  uint32_t val_32b_reg_ty_id = type_mgr->GetId(val_32b_reg_ty);
  if (is_signed)
    return builder->AddUnaryOp(val_32b_reg_ty_id, spv::Op::OpSConvert, val_id)
        ->result_id();
  else
    return builder->AddUnaryOp(val_32b_reg_ty_id, spv::Op::OpUConvert, val_id)
        ->result_id();
}